

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O2

Node * __thiscall Parser::parseConstStatement(Parser *this,Token *const_token,bool is_global)

{
  pointer ppNVar1;
  NodeType NVar2;
  Node *name;
  Node *value;
  Node *pNVar3;
  Node *pNVar4;
  
  expect(this,TK_IDENTIFIER);
  name = createIdentifierNode(this,this->tok);
  expect(this,TK_ASSIGN);
  value = parseTernaryOp(this);
  NVar2 = value->nodeType;
  pNVar3 = value;
  if (NVar2 == PNT_UNARY_PRE_OP) {
    pNVar4 = value;
    if ((value->tok->type == TK_MINUS) &&
       (ppNVar1 = (value->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
       (long)(value->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppNVar1 == 8)) {
      pNVar3 = *ppNVar1;
      NVar2 = pNVar3->nodeType;
      if ((NVar2 == PNT_FLOAT) || (NVar2 == PNT_INTEGER)) goto LAB_0010e5ac;
    }
  }
  else {
LAB_0010e5ac:
    pNVar4 = pNVar3;
    if (NVar2 - PNT_INTEGER < 4) goto LAB_0010e5d7;
  }
  CompilationContext::error
            (this->ctx,0x82,"expected scalar (boolean, integer, float, string)",pNVar4->tok->line,
             (uint)pNVar4->tok->column);
LAB_0010e5d7:
  pNVar3 = createConstDeclarationNode(this,const_token,name,value,is_global);
  return pNVar3;
}

Assistant:

Node * parseConstStatement(Token * const_token, bool is_global)
  {
    expect(TK_IDENTIFIER);
    Node * name = createIdentifierNode(*tok);
    expect(TK_ASSIGN);
    Node * value = parseTernaryOp();

#define ACCEPT_ONLY_SCALAR_CONST 1
#if (ACCEPT_ONLY_SCALAR_CONST)
    Node * check = value;
    if (check->nodeType == PNT_UNARY_PRE_OP && check->tok.type == TK_MINUS && check->children.size() == 1 &&
      (check->children[0]->nodeType == PNT_FLOAT || check->children[0]->nodeType == PNT_INTEGER))
    {
      check = value->children[0];
    }

    if (check && check->nodeType != PNT_INTEGER && check->nodeType != PNT_BOOL && check->nodeType != PNT_FLOAT &&
      check->nodeType != PNT_STRING)
    {
      ctx.error(130, "expected scalar (boolean, integer, float, string)", check->tok.line, check->tok.column);
    }

#endif

    return createConstDeclarationNode(*const_token, name, value, is_global);
  }